

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

uint * Vec_IntFetch(Vec_Int_t *p,int nWords)

{
  int nWords_local;
  Vec_Int_t *p_local;
  
  if (nWords == 0) {
    p_local = (Vec_Int_t *)0x0;
  }
  else {
    if (nWords < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x37f,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    p->nSize = nWords + p->nSize;
    if (p->nCap < p->nSize) {
      p_local = (Vec_Int_t *)0x0;
    }
    else {
      p_local = (Vec_Int_t *)(p->pArray + ((long)p->nSize - (long)nWords));
    }
  }
  return (uint *)p_local;
}

Assistant:

static inline unsigned * Vec_IntFetch( Vec_Int_t * p, int nWords )
{
    if ( nWords == 0 )
        return NULL;
    assert( nWords > 0 );
    p->nSize += nWords;
    if ( p->nSize > p->nCap )
    {
//         Vec_IntGrow( p, 2 * p->nSize );
        return NULL;
    }
    return ((unsigned *)p->pArray) + p->nSize - nWords;
}